

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O1

Abc_Obj_t * Dec_GraphToNetwork(Abc_Ntk_t *pNtk,Dec_Graph_t *pGraph)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  long lVar3;
  Abc_Obj_t *pAVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  if (pGraph->fConst == 0) {
    uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    lVar6 = (long)pGraph->nLeaves;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pAVar4 = (Abc_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pGraph->pNodes[uVar5].field_2.pFunc);
    }
    else {
      lVar3 = lVar6 * 0x18 + 8;
      do {
        lVar7 = lVar3;
        pDVar2 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pDVar2 + lVar7 + -8);
        uVar1 = *(uint *)((long)pDVar2 + lVar7 + -4);
        pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(uVar5 & 1) ^
                            (ulong)pDVar2[uVar5 >> 1 & 0x3fffffff].field_2.pFunc),
                            (Abc_Obj_t *)
                            ((ulong)(uVar1 & 1) ^
                            (ulong)pDVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc));
        *(Abc_Obj_t **)(&(pDVar2->eEdge0).field_0x0 + lVar7) = pAVar4;
        lVar6 = lVar6 + 1;
        lVar3 = lVar7 + 0x18;
      } while (lVar6 < pGraph->nSize);
      pAVar4 = (Abc_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ *(ulong *)(&(pDVar2->eEdge0).field_0x0 + lVar7));
    }
  }
  else {
    pAVar4 = Abc_AigConst1(pNtk);
    pAVar4 = (Abc_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pAVar4);
  }
  return pAVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description [AIG nodes for the fanins should be assigned to pNode->pFunc
  of the leaves of the graph before calling this procedure.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Dec_GraphToNetwork( Abc_Ntk_t * pNtk, Dec_Graph_t * pGraph )
{
    Abc_Obj_t * pAnd0, * pAnd1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtk), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_ObjNotCond( (Abc_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}